

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_posix.c
# Opt level: O0

int mutex_lock(mutex_handle *mutex)

{
  pthread_cond_t *__cond;
  int iVar1;
  int ret;
  mutex_priv *priv;
  mutex_handle *mutex_local;
  
  __cond = (pthread_cond_t *)mutex->priv;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(__cond + 1));
  if (iVar1 == 0) {
    do {
      if (*(int *)((long)__cond + 0x58) == 0) {
        return 0;
      }
      iVar1 = pthread_cond_wait(__cond,(pthread_mutex_t *)(__cond + 1));
    } while (iVar1 == 0);
    pthread_mutex_unlock((pthread_mutex_t *)(__cond + 1));
  }
  mutex_local._4_4_ = -iVar1;
  return mutex_local._4_4_;
}

Assistant:

int mutex_lock(struct mutex_handle *mutex)
{
	struct mutex_priv *priv = mutex->priv;
	int ret;

	ret = pthread_mutex_lock(&priv->lock);
	if (ret != 0)
		return -ret;

	while (priv->readers > 0) {
		ret = pthread_cond_wait(&priv->cond, &priv->lock);
		if (ret != 0) {
			ret = -ret;
			goto mutex_lock_exit;
		}
	}

	return 0;

mutex_lock_exit:
	pthread_mutex_unlock(&priv->lock);

	return ret;
}